

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::VerifyFinalize(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t sVar4;
  
  if (((this->collectionState).value & CollectionStateMark) != CollectionStateNotCollecting) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x2445,"(!this->IsMarkState())","!this->IsMarkState()");
    if (!bVar2) goto LAB_00683c01;
    *puVar3 = 0;
  }
  sVar4 = HeapInfoManager::GetFinalizeCount(&this->autoHeap);
  if (sVar4 != (this->collectionStats).finalizeCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x2449,
                       "(currentFinalizableObjectCount == this->collectionStats.finalizeCount)",
                       "currentFinalizableObjectCount == this->collectionStats.finalizeCount");
    if (!bVar2) {
LAB_00683c01:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void
Recycler::VerifyFinalize()
{
    // We can't check this if we are marking
    Assert(!this->IsMarkState());

    size_t currentFinalizableObjectCount = this->autoHeap.GetFinalizeCount();
#if DBG
    Assert(currentFinalizableObjectCount == this->collectionStats.finalizeCount);
#else
    if (currentFinalizableObjectCount != >this->collectionStats.finalizeCount)
    {
        Output::Print(_u("ERROR: Recycler dropped some finalizable objects"));
        DebugBreak();
    }
#endif
}